

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_2d_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  uint16_t uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  short *psVar16;
  int iVar17;
  short *psVar18;
  long lVar19;
  ulong local_8ba0;
  short *local_8b90;
  uint local_8b58;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  uVar5 = (h + (uint)uVar1) - 1;
  iVar10 = (uVar1 >> 1) - 1;
  lVar19 = (long)w;
  bVar8 = (byte)conv_params->round_0;
  if (0 < (int)uVar5) {
    uVar2 = filter_params_x->taps;
    piVar3 = filter_params_x->filter_ptr;
    iVar13 = 1 << ((char)bd + 6U & 0x1f);
    iVar11 = 1 - (uint)(uVar2 >> 1);
    local_8b90 = (short *)0x0;
    do {
      if (0 < w) {
        uVar14 = 0;
        iVar17 = iVar11;
        do {
          iVar15 = iVar13;
          if (uVar2 != 0) {
            uVar6 = 0;
            do {
              iVar15 = iVar15 + (uint)src[((long)iVar17 + uVar6) - (long)(iVar10 * src_stride)] *
                                (int)*(short *)((long)piVar3 +
                                               uVar6 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar6 = uVar6 + 1;
            } while ((uint)uVar2 != uVar6);
          }
          asStack_8b38[uVar14 + (long)local_8b90 * lVar19] =
               (short)(iVar15 + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f));
          uVar14 = uVar14 + 1;
          iVar17 = iVar17 + 1;
        } while (uVar14 != (uint)w);
      }
      local_8b90 = (short *)((long)local_8b90 + 1);
      iVar11 = iVar11 + src_stride;
    } while (local_8b90 != (short *)(ulong)uVar5);
  }
  local_8b58 = (uint)uVar1;
  if (0 < h) {
    bVar4 = (byte)conv_params->round_1;
    bVar7 = ('\x0e' - bVar8) - bVar4;
    piVar3 = filter_params_y->filter_ptr;
    bVar8 = ((char)bd - bVar8) + 0xe;
    iVar11 = 1 << (bVar8 & 0x1f);
    bVar8 = bVar8 - bVar4;
    local_8b90 = asStack_8b38 + (1 - (ulong)(uint)(uVar1 >> 1)) * lVar19 + (long)(iVar10 * w);
    local_8ba0 = 0;
    do {
      if (0 < w) {
        uVar14 = 0;
        psVar16 = local_8b90;
        do {
          iVar10 = iVar11;
          if ((ulong)filter_params_y->taps != 0) {
            uVar6 = 0;
            psVar18 = psVar16;
            do {
              iVar10 = iVar10 + (int)*psVar18 *
                                (int)*(short *)((long)piVar3 +
                                               uVar6 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * local_8b58 * 2));
              uVar6 = uVar6 + 1;
              psVar18 = psVar18 + lVar19;
            } while (filter_params_y->taps != uVar6);
          }
          uVar5 = (iVar10 + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f)) +
                  ((1 << (bVar7 & 0x1f)) >> 1) + (-1 << (bVar8 & 0x1f)) + (-1 << (bVar8 - 1 & 0x1f))
                  >> (bVar7 & 0x1f);
          if (bd == 10) {
            uVar12 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar12 = 0xfff;
          }
          else {
            uVar12 = 0xff;
          }
          if (uVar5 < uVar12) {
            uVar12 = uVar5;
          }
          uVar9 = (uint16_t)uVar12;
          if ((int)uVar5 < 0) {
            uVar9 = 0;
          }
          dst[local_8ba0 * (long)dst_stride + uVar14] = uVar9;
          uVar14 = uVar14 + 1;
          psVar16 = psVar16 + 1;
        } while (uVar14 != (uint)w);
      }
      local_8ba0 = local_8ba0 + 1;
      local_8b90 = local_8b90 + lVar19;
    } while (local_8ba0 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_c(const uint16_t *src, int src_stride,
                                 uint16_t *dst, int dst_stride, int w, int h,
                                 const InterpFilterParams *filter_params_x,
                                 const InterpFilterParams *filter_params_y,
                                 const int subpel_x_qn, const int subpel_y_qn,
                                 ConvolveParams *conv_params, int bd) {
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);

  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      int32_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                    ((1 << (offset_bits - conv_params->round_1)) +
                     (1 << (offset_bits - conv_params->round_1 - 1)));
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
  }
}